

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

Bool tidyNodeIsProp(TidyDoc tdoc,TidyNode tnod)

{
  uint uVar1;
  Bool BVar2;
  
  BVar2 = yes;
  if ((tnod != (TidyNode)0x0) && (uVar1 = tnod[0x14]._opaque, uVar1 < 0xe)) {
    if ((0x211fU >> (uVar1 & 0x1f) & 1) == 0) {
      if (((0xe0U >> (uVar1 & 0x1f) & 1) != 0) && (*(long *)(tnod + 0xe) != 0)) {
        return (Bool)((*(byte *)(*(long *)(tnod + 0xe) + 0x11) & 0xe0) != 0);
      }
    }
    else {
      BVar2 = no;
    }
  }
  return BVar2;
}

Assistant:

Bool TIDY_CALL tidyNodeIsProp( TidyDoc ARG_UNUSED(tdoc), TidyNode tnod )
{
  Node* nimp = tidyNodeToImpl( tnod );
  Bool isProprietary = yes;
  if ( nimp )
  {
    switch ( nimp->type )
    {
    case RootNode:
    case DocTypeTag:
    case CommentTag:
    case XmlDecl:
    case ProcInsTag:
    case TextNode:
    case CDATATag:
        isProprietary = no;
        break;

    case SectionTag:
    case AspTag:
    case JsteTag:
    case PhpTag:
        isProprietary = yes;
        break;

    case StartTag:
    case EndTag:
    case StartEndTag:
        isProprietary = ( nimp->tag
                          ? (nimp->tag->versions&VERS_PROPRIETARY)!=0
                          : yes );
        break;
    }
  }
  return isProprietary;
}